

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<12,_11,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  Vector<float,_2> *pVVar1;
  bool bVar2;
  int i;
  bool bVar3;
  long lVar4;
  Vector<float,_2> *pVVar5;
  float *pfVar6;
  int col;
  long lVar7;
  int col_1;
  int col_2;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float afStack_b0 [6];
  float local_98 [6];
  Vector<float,_3> res;
  float fStack_74;
  Matrix<float,_2,_4> retVal_1;
  Matrix<float,_2,_4> retVal;
  int aiStack_18 [6];
  
  pVVar1 = (Vector<float,_2> *)(retVal.m_data.m_data[3].m_data + 1);
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    pVVar5 = retVal.m_data.m_data + 3;
    bVar2 = true;
    do {
      bVar3 = bVar2;
      lVar7 = 0;
      do {
        fVar8 = 1.0;
        if (lVar4 != lVar7) {
          fVar8 = 0.0;
        }
        pVVar5[lVar7].m_data[0] = fVar8;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      lVar4 = 1;
      pVVar5 = pVVar1;
      bVar2 = false;
    } while (bVar3);
    retVal.m_data.m_data[3].m_data = *(float (*) [2])evalCtx->in[0].m_data;
  }
  else {
    retVal.m_data.m_data[3].m_data[0] = 0.0;
    retVal.m_data.m_data[3].m_data[1] = 0.0;
    lVar4 = 0;
    pVVar5 = retVal.m_data.m_data + 3;
    bVar2 = true;
    do {
      bVar3 = bVar2;
      lVar7 = 0;
      do {
        pVVar5[lVar7].m_data[0] = *(float *)((long)&s_constInMat4x2 + lVar4 + lVar7 * 4);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      lVar4 = 0x10;
      pVVar5 = pVVar1;
      bVar2 = false;
    } while (bVar3);
  }
  retVal_1.m_data.m_data[1].m_data[0] = 0.0;
  retVal_1.m_data.m_data[1].m_data[1] = 0.0;
  retVal_1.m_data.m_data[2].m_data[0] = 0.0;
  retVal_1.m_data.m_data[2].m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  fStack_74 = 0.0;
  retVal_1.m_data.m_data[0].m_data[0] = 0.0;
  retVal_1.m_data.m_data[0].m_data[1] = 0.0;
  lVar4 = 0;
  pfVar6 = res.m_data + 2;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    lVar7 = 0;
    do {
      fVar8 = 1.0;
      if (lVar4 != lVar7) {
        fVar8 = 0.0;
      }
      pfVar6[lVar7 * 2] = fVar8;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    lVar4 = 1;
    pfVar6 = &fStack_74;
    bVar2 = false;
  } while (bVar3);
  pfVar6 = res.m_data + 2;
  pVVar5 = retVal.m_data.m_data + 3;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    lVar4 = 0;
    do {
      pfVar6[lVar4 * 2] = pVVar5[lVar4].m_data[0] + -1.0;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    pfVar6 = &fStack_74;
    pVVar5 = pVVar1;
    bVar2 = false;
  } while (bVar3);
  fVar11 = retVal_1.m_data.m_data[2].m_data[0] + res.m_data[2] + fStack_74;
  fVar12 = retVal_1.m_data.m_data[2].m_data[1] +
           retVal_1.m_data.m_data[0].m_data[1] + retVal_1.m_data.m_data[0].m_data[0];
  retVal.m_data.m_data[1].m_data[0] = fVar11;
  retVal.m_data.m_data[1].m_data[1] = fVar12;
  retVal.m_data.m_data[2].m_data[0] =
       retVal_1.m_data.m_data[1].m_data[0] + retVal_1.m_data.m_data[1].m_data[1];
  local_98[4] = 0.0;
  local_98[5] = 0.0;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_98[2] = 0.0;
  local_98[3] = 0.0;
  lVar4 = 0;
  pfVar6 = local_98;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    lVar7 = 0;
    do {
      fVar8 = 1.0;
      if (lVar4 != lVar7) {
        fVar8 = 0.0;
      }
      pfVar6[lVar7 * 2] = fVar8;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    lVar4 = 1;
    pfVar6 = local_98 + 1;
    bVar2 = false;
  } while (bVar3);
  pfVar6 = local_98;
  pVVar5 = retVal.m_data.m_data + 3;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    lVar4 = 0;
    do {
      pfVar6[lVar4 * 2] = pVVar5[lVar4].m_data[0] + -1.0;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    pfVar6 = local_98 + 1;
    pVVar5 = pVVar1;
    bVar2 = false;
  } while (bVar3);
  fVar9 = res.m_data[0] + local_98[0] + local_98[1];
  fVar10 = res.m_data[1] + local_98[3] + local_98[2];
  retVal_1.m_data.m_data[3].m_data[0] = fVar9;
  retVal_1.m_data.m_data[3].m_data[1] = fVar10;
  retVal.m_data.m_data[0].m_data[0] = local_98[4] + local_98[5];
  afStack_b0[2] = 0.0;
  afStack_b0[3] = 0.0;
  afStack_b0[4] = 0.0;
  lVar4 = 0;
  do {
    afStack_b0[lVar4 + 2] =
         retVal.m_data.m_data[1].m_data[lVar4] +
         *(float *)((long)(retVal.m_data.m_data + -1) + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar4]] = afStack_b0[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(in0)) + reduceToVec3(decrement(in0));
	}